

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O0

void intgemm::TestMultiplyBiasRelu<intgemm::AVX512BW::Kernels16>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWriteRelu callback;
  anon_class_16_2_a84000ed callback_00;
  float unquant_mult_00;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  anon_class_8_1_8989cfb7 callback_01;
  float *B_00;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar4;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<short> B_quant;
  AlignedVector<float> test_C;
  AlignedVector<short> B_prep;
  AlignedVector<short> A_prep;
  float unquant_mult;
  float quant_mult;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe878;
  Index cols;
  Index in_stack_ffffffffffffe880;
  undefined4 uVar5;
  float in_stack_ffffffffffffe884;
  undefined4 uVar6;
  int16_t *in_stack_ffffffffffffe888;
  AlignedVector<float> *in_stack_ffffffffffffe890;
  undefined8 in_stack_ffffffffffffe8a0;
  Index IVar8;
  AlignedVector<float> *pAVar7;
  undefined8 in_stack_ffffffffffffe8a8;
  float *in_stack_ffffffffffffe8b0;
  short *in_stack_ffffffffffffe8b8;
  short *in_stack_ffffffffffffe8c0;
  string local_1680 [4];
  Index in_stack_ffffffffffffe984;
  Index in_stack_ffffffffffffe988;
  float in_stack_ffffffffffffe98c;
  int16_t *in_stack_ffffffffffffe990;
  float *in_stack_ffffffffffffe998;
  AlignedVector<float> local_1658;
  float *local_1648;
  AlignedVector<float> *pAStack_1640;
  AlignedVector<float> local_1638;
  AlignedVector<short> local_1628;
  UnquantizeAndAddBiasAndWriteRelu local_1618;
  AlignedVector<float> local_1600;
  Index in_stack_ffffffffffffea18;
  float in_stack_ffffffffffffea1c;
  int16_t *in_stack_ffffffffffffea20;
  float *in_stack_ffffffffffffea28;
  float local_15d0 [2];
  float *local_15c8;
  float *local_15c0;
  float *local_15b8;
  AlignedVector<float> *local_15b0;
  float *local_15a8;
  float *local_15a0;
  float *local_1598;
  AlignedVector<float> *local_1590;
  float *local_1588;
  float *local_1580;
  float *local_1578;
  AlignedVector<float> *local_1570;
  float in_stack_fffffffffffff060;
  float in_stack_fffffffffffff064;
  float in_stack_fffffffffffff068;
  float in_stack_fffffffffffff06c;
  string *in_stack_fffffffffffff070;
  size_t in_stack_fffffffffffff078;
  float *in_stack_fffffffffffff080;
  float *in_stack_fffffffffffff088;
  float *in_stack_fffffffffffff090;
  Index in_stack_fffffffffffffdc4;
  Index in_stack_fffffffffffffdc8;
  Index in_stack_fffffffffffffdcc;
  int16_t *in_stack_fffffffffffffdd0;
  int16_t *in_stack_fffffffffffffdd8;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"16-bit AVX512");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x247ebf);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),
             (float)((ulong)in_stack_ffffffffffffe878 >> 0x20),SUB84(in_stack_ffffffffffffe878,0));
  local_1570 = local_1b8;
  local_1578 = AlignedVector<float>::begin(local_1570);
  local_1580 = AlignedVector<float>::end(local_1570);
  for (; local_1578 != local_1580; local_1578 = local_1578 + 1) {
    local_1588 = local_1578;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),
                       in_stack_ffffffffffffe878);
    *local_1588 = rVar4;
  }
  local_1590 = &local_1c8;
  local_1598 = AlignedVector<float>::begin(local_1590);
  local_15a0 = AlignedVector<float>::end(local_1590);
  for (; local_1598 != local_15a0; local_1598 = local_1598 + 1) {
    local_15a8 = local_1598;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),
                       in_stack_ffffffffffffe878);
    *local_15a8 = rVar4;
  }
  local_15b0 = &local_1d8;
  local_15b8 = AlignedVector<float>::begin(local_15b0);
  local_15c0 = AlignedVector<float>::end(local_15b0);
  for (; IVar8 = (Index)((ulong)in_stack_ffffffffffffe8a0 >> 0x20), local_15b8 != local_15c0;
      local_15b8 = local_15b8 + 1) {
    local_15c8 = local_15b8;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),
                       in_stack_ffffffffffffe878);
    *local_15c8 = rVar4;
  }
  local_15d0[1] = 1024.0;
  local_15d0[0] = 9.536743e-07;
  AlignedVector<float>::size(local_1b8);
  cols = (Index)((ulong)in_stack_ffffffffffffe878 >> 0x20);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880));
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<short>::begin((AlignedVector<short> *)&stack0xffffffffffffea20);
  AVX512BW::Kernels16::PrepareA
            ((float *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888,in_stack_ffffffffffffe884,
             in_stack_ffffffffffffe880,cols);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<short>::begin((AlignedVector<short> *)&stack0xffffffffffffea10);
  AVX512BW::Kernels16::PrepareB
            (in_stack_ffffffffffffe998,in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c,
             in_stack_ffffffffffffe988,in_stack_ffffffffffffe984);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880));
  AlignedVector<short>::begin((AlignedVector<short> *)&stack0xffffffffffffea20);
  AlignedVector<short>::begin((AlignedVector<short> *)&stack0xffffffffffffea10);
  unquant_mult_00 = local_15d0[0];
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1600);
  callbacks::UnquantizeAndAddBiasAndWriteRelu::UnquantizeAndAddBiasAndWriteRelu
            (&local_1618,unquant_mult_00,pfVar2,pfVar3);
  uVar5 = SUB84(local_1618.bias_addr,0);
  uVar6 = (undefined4)((ulong)local_1618.bias_addr >> 0x20);
  callback.bias_addr = local_1618.output_addr;
  callback._0_8_ = local_1618.bias_addr;
  callback.output_addr = (float *)in_stack_ffffffffffffe890;
  AVX512BW::Kernels16::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
             in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,callback);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_ffffffffffffe890,(size_t)local_1618.output_addr,
             CONCAT44(uVar6,uVar5));
  pAVar7 = &local_1c8;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<short>::begin(&local_1628);
  AlignedVector<float>::size(pAVar7);
  AVX512BW::Kernels16::Quantize
            (in_stack_ffffffffffffea28,in_stack_ffffffffffffea20,in_stack_ffffffffffffea1c,
             in_stack_ffffffffffffea18);
  AlignedVector<float>::size(&local_1600);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)local_1618.output_addr,CONCAT44(uVar6,uVar5));
  pfVar2 = (float *)AlignedVector<short>::begin((AlignedVector<short> *)&stack0xffffffffffffea20);
  callback_01.bias = (AlignedVector<float> *)AlignedVector<short>::begin(&local_1628);
  AlignedVector<float>::begin(&local_1638);
  local_1648 = local_15d0;
  pAStack_1640 = &local_1d8;
  callback_00.bias = pAVar7;
  callback_00.unquant_mult = (float *)callback_01.bias;
  pAVar7 = pAStack_1640;
  references::
  Multiply<short,_short,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:460:99),_nullptr>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
             (Index)((ulong)in_stack_ffffffffffffe8a8 >> 0x20),(Index)in_stack_ffffffffffffe8a8,
             IVar8,callback_00);
  IVar8 = (Index)((ulong)in_stack_ffffffffffffe8a8 >> 0x20);
  AlignedVector<float>::size(&local_1600);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)local_1618.output_addr,(size_t)pAVar7);
  pfVar3 = AlignedVector<float>::begin(local_1b8);
  B_00 = AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin(&local_1658);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:465:86),_nullptr>
            (pfVar2,B_00,pfVar3,(Index)((ulong)in_stack_ffffffffffffe8b0 >> 0x20),
             (Index)in_stack_ffffffffffffe8b0,IVar8,callback_01);
  AlignedVector<float>::begin(&local_1658);
  AlignedVector<float>::begin(&local_1638);
  pAVar7 = &local_1600;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<float>::size(pAVar7);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_fffffffffffff090,in_stack_fffffffffffff088,in_stack_fffffffffffff080,
             in_stack_fffffffffffff078,in_stack_fffffffffffff070,in_stack_fffffffffffff06c,
             in_stack_fffffffffffff068,in_stack_fffffffffffff064,in_stack_fffffffffffff060);
  std::__cxx11::string::~string(local_1680);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x2485ee);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x2485fb);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x248608);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x248615);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x248622);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x24862f);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x24863c);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x248649);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x248656);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyBiasRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance = 0.1f, float float_tolerance = 1.0f, float MSE_float_tolerance = 0.0f, float MSE_int_tolerance = 0.0f) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWriteRelu(unquant_mult, bias.begin(), test_C.begin()));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, sum * unquant_mult + bias[info.col_idx]);
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, static_cast<float>(sum) + bias[info.col_idx]);
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}